

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildAsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *pOVar5;
  RegOpnd *pRVar6;
  RegOpnd *src1;
  RegOpnd *this_00;
  Instr *pIVar7;
  Opnd *pOVar8;
  IntConstOpnd *src1_00;
  RegOpnd *shuffleOpnd;
  Instr *pIStack_48;
  uint i;
  Instr *instr;
  RegOpnd *dstOpnd;
  RegOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *layout;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  bVar2 = OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode);
  if ((!bVar2) || (newOpcode != Simd128_Shuffle_V8X16)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x174a,
                       "(OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode) && newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_V8X16)"
                       ,
                       "OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode) && newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_V8X16"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar5 = Js::ByteCodeReader::
           GetLayout<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
                     (&this->m_jnReader);
  RVar3 = GetRegSlotFromSimd128Reg(this,pOVar5->R1);
  pRVar6 = BuildSrcOpnd(this,RVar3,TySimd128U16);
  RVar3 = GetRegSlotFromSimd128Reg(this,pOVar5->R2);
  src1 = BuildSrcOpnd(this,RVar3,TySimd128U16);
  RVar3 = GetRegSlotFromSimd128Reg(this,pOVar5->R0);
  this_00 = BuildDstOpnd(this,RVar3,TySimd128U16);
  IR::Opnd::SetValueType(&this_00->super_Opnd,ValueType::Simd);
  IR::Opnd::SetValueType(&pRVar6->super_Opnd,ValueType::Simd);
  IR::Opnd::SetValueType(&src1->super_Opnd,ValueType::Simd);
  pIVar7 = AddExtendedArg(this,pRVar6,(RegOpnd *)0x0,offset);
  pOVar8 = IR::Instr::GetDst(pIVar7);
  pRVar6 = IR::Opnd::AsRegOpnd(pOVar8);
  pIStack_48 = AddExtendedArg(this,src1,pRVar6,offset);
  for (shuffleOpnd._4_4_ = 0; shuffleOpnd._4_4_ < 0x10; shuffleOpnd._4_4_ = shuffleOpnd._4_4_ + 1) {
    src1_00 = IR::IntConstOpnd::New
                        ((ulong)pOVar5->INDICES[shuffleOpnd._4_4_],TyInt32,this->m_func,false);
    pOVar8 = IR::Instr::GetDst(pIStack_48);
    pRVar6 = IR::Opnd::AsRegOpnd(pOVar8);
    pIStack_48 = AddExtendedArg(this,(RegOpnd *)src1_00,pRVar6,offset);
  }
  pOVar8 = IR::Instr::GetDst(pIStack_48);
  pIVar7 = IR::Instr::New(Simd128_Shuffle_U16,&this_00->super_Opnd,pOVar8,this->m_func);
  AddInstr(this,pIVar7,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildAsmShuffle(Js::OpCodeAsmJs newOpcode, uint32 offset)
{
    Assert(OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode) && newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_V8X16);
    auto layout = m_jnReader.GetLayout<Js::OpLayoutT_AsmShuffle<SizePolicy>>();

    IR::RegOpnd * src1Opnd = BuildSrcOpnd(GetRegSlotFromSimd128Reg(layout->R1), TySimd128U16);
    IR::RegOpnd * src2Opnd = BuildSrcOpnd(GetRegSlotFromSimd128Reg(layout->R2), TySimd128U16);
    IR::RegOpnd * dstOpnd = BuildDstOpnd(GetRegSlotFromSimd128Reg(layout->R0), TySimd128U16);
    dstOpnd->SetValueType(ValueType::Simd);
    src1Opnd->SetValueType(ValueType::Simd);
    src2Opnd->SetValueType(ValueType::Simd);

    IR::Instr * instr = nullptr;
    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);

    for (uint i = 0; i < Wasm::Simd::MAX_LANES; i++)
    {
        IR::RegOpnd* shuffleOpnd = (IR::RegOpnd*)IR::IntConstOpnd::New(layout->INDICES[i], TyInt32, this->m_func);
        instr = AddExtendedArg(shuffleOpnd, instr->GetDst()->AsRegOpnd(), offset);
    }
    AddInstr(IR::Instr::New(Js::OpCode::Simd128_Shuffle_U16, dstOpnd, instr->GetDst(), m_func), offset);
}